

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::TreeEnsembleClassifier::Clear(TreeEnsembleClassifier *this)

{
  if (this->treeensemble_ != (TreeEnsembleParameters *)0x0) {
    (*(this->treeensemble_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->treeensemble_ = (TreeEnsembleParameters *)0x0;
  this->postevaluationtransform_ = 0;
  clear_ClassLabels(this);
  return;
}

Assistant:

void TreeEnsembleClassifier::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.TreeEnsembleClassifier)
  if (GetArenaNoVirtual() == NULL && treeensemble_ != NULL) {
    delete treeensemble_;
  }
  treeensemble_ = NULL;
  postevaluationtransform_ = 0;
  clear_ClassLabels();
}